

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_response.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
LookupResponse::ToString(LookupResponse *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_18 [24];
  
  __lhs = in_RDI;
  FileInfo::ToString((FileInfo *)this);
  std::operator+((char *)__lhs,in_RDI);
  std::string::~string(local_18);
  return in_RDI;
}

Assistant:

virtual string ToString() const {
    return "LookupResponse:: " + file_info_.ToString();
  }